

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O0

void predict_or_learn<false,true>(interact *in,single_learner *base,example *ec)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte *pbVar4;
  uchar *__src;
  features *src;
  features *this;
  v_array<unsigned_char> *in_RDX;
  byte *in_RDI;
  size_t i;
  features *in_stack_00000038;
  int n2_i;
  features *f2;
  features *f1;
  features *in_stack_ffffffffffffff98;
  features *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar5;
  learner<char,_example> *in_stack_ffffffffffffffb0;
  ulong local_38;
  int local_2c;
  
  bVar5 = *in_RDI;
  bVar1 = in_RDI[1];
  bVar2 = contains_valid_namespaces
                    ((vw *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(interact *)0x2f0c8b);
  if (bVar2) {
    *(uchar **)(in_RDI + 0x80) = in_RDX[0x345]._begin;
    *(undefined4 *)(in_RDI + 0x7c) = *(undefined4 *)((long)&in_RDX[0x345].end_array + 4);
    *(float *)((long)&in_RDX[0x345].end_array + 4) =
         *(float *)((long)&in_RDX[0x345].end_array + 4) -
         *(float *)((long)in_RDX + (ulong)bVar5 * 0x68 + 0x80);
    *(float *)((long)&in_RDX[0x345].end_array + 4) =
         *(float *)((long)&in_RDX[0x345].end_array + 4) -
         *(float *)((long)in_RDX + (ulong)bVar1 * 0x68 + 0x80);
    sVar3 = features::size((features *)0x2f0d26);
    in_RDX[0x345]._begin = in_RDX[0x345]._begin + -sVar3;
    sVar3 = features::size((features *)0x2f0d49);
    in_RDX[0x345]._begin = in_RDX[0x345]._begin + -sVar3;
    features::deep_copy_from(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    multiply(f2,in_stack_00000038,(interact *)i);
    *(float *)((long)&in_RDX[0x345].end_array + 4) =
         *(float *)((long)in_RDX + (ulong)bVar5 * 0x68 + 0x80) +
         *(float *)((long)&in_RDX[0x345].end_array + 4);
    sVar3 = features::size((features *)0x2f0db2);
    in_RDX[0x345]._begin = in_RDX[0x345]._begin + sVar3;
    local_2c = -1;
    local_38 = 0;
    while( true ) {
      sVar3 = v_array<unsigned_char>::size(in_RDX);
      if (sVar3 <= local_38) break;
      pbVar4 = v_array<unsigned_char>::operator[](in_RDX,local_38);
      if (*pbVar4 == in_RDI[1]) {
        local_2c = (int)local_38;
        in_stack_ffffffffffffffb0 =
             (learner<char,_example> *)v_array<unsigned_char>::operator[](in_RDX,(long)local_2c);
        __src = v_array<unsigned_char>::operator[](in_RDX,(long)(local_2c + 1));
        sVar3 = v_array<unsigned_char>::size(in_RDX);
        memmove(in_stack_ffffffffffffffb0,__src,(sVar3 - (long)local_2c) - 1);
        v_array<unsigned_char>::decr(in_RDX);
        break;
      }
      local_38 = local_38 + 1;
    }
    LEARNER::learner<char,_example>::predict
              (in_stack_ffffffffffffffb0,
               (example *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
               (size_t)in_stack_ffffffffffffffa0);
    v_array<unsigned_char>::incr((v_array<unsigned_char> *)in_stack_ffffffffffffffa0);
    src = (features *)v_array<unsigned_char>::operator[](in_RDX,(long)(local_2c + 1));
    this = (features *)v_array<unsigned_char>::operator[](in_RDX,(long)local_2c);
    sVar3 = v_array<unsigned_char>::size(in_RDX);
    memmove(src,this,(sVar3 - (long)local_2c) - 1);
    bVar5 = in_RDI[1];
    pbVar4 = v_array<unsigned_char>::operator[](in_RDX,(long)local_2c);
    *pbVar4 = bVar5;
    features::deep_copy_from(this,src);
    *(undefined4 *)((long)&in_RDX[0x345].end_array + 4) = *(undefined4 *)(in_RDI + 0x7c);
    in_RDX[0x345]._begin = *(uchar **)(in_RDI + 0x80);
  }
  else {
    LEARNER::learner<char,_example>::predict
              (in_stack_ffffffffffffffb0,
               (example *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
               (size_t)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void predict_or_learn(interact& in, LEARNER::single_learner& base, example& ec)
{
  features& f1 = ec.feature_space[in.n1];
  features& f2 = ec.feature_space[in.n2];

  if (!contains_valid_namespaces(*in.all, f1, f2, in))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    return;
  }

  in.num_features = ec.num_features;
  in.total_sum_feat_sq = ec.total_sum_feat_sq;
  ec.total_sum_feat_sq -= f1.sum_feat_sq;
  ec.total_sum_feat_sq -= f2.sum_feat_sq;
  ec.num_features -= f1.size();
  ec.num_features -= f2.size();

  in.feat_store.deep_copy_from(f1);

  multiply(f1, f2, in);
  ec.total_sum_feat_sq += f1.sum_feat_sq;
  ec.num_features += f1.size();

  /*for(uint64_t i = 0;i < f1.size();i++)
    cout<<f1[i].weight_index<<":"<<f1[i].x<<" ";
    cout<<endl;*/

  // remove 2nd namespace
  int n2_i = -1;
  for (size_t i = 0; i < ec.indices.size(); i++)
  {
    if (ec.indices[i] == in.n2)
    {
      n2_i = (int)i;
      memmove(&ec.indices[n2_i], &ec.indices[n2_i + 1], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
      ec.indices.decr();
      break;
    }
  }

  base.predict(ec);
  if (is_learn)
    base.learn(ec);

  // re-insert namespace into the right position
  ec.indices.incr();
  memmove(&ec.indices[n2_i + 1], &ec.indices[n2_i], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
  ec.indices[n2_i] = in.n2;

  f1.deep_copy_from(in.feat_store);
  ec.total_sum_feat_sq = in.total_sum_feat_sq;
  ec.num_features = in.num_features;
}